

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_opt.h
# Opt level: O0

float box_integral_improved(integral_image *iimage,int row,int col,int rows,int cols)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float D;
  float C;
  float B;
  float A;
  int _b_3;
  int _a_3;
  int c1;
  int _b_2;
  int _a_2;
  int r1;
  int _b_1;
  int _a_1;
  int c0;
  int _b;
  int _a;
  int r0;
  float res;
  float temp1;
  float temp0;
  int height;
  int width;
  int data_width;
  float *data;
  
  lVar2 = *(long *)(in_RDI + 2);
  iVar1 = in_RDI[4];
  local_98 = *in_RDI;
  local_94 = in_RDI[1];
  local_8c = local_94;
  if (in_ESI < local_94) {
    local_8c = in_ESI;
  }
  local_8c = local_8c + -1;
  local_90 = local_98;
  if (in_EDX < local_98) {
    local_90 = in_EDX;
  }
  local_90 = local_90 + -1;
  if (in_ESI + in_ECX < local_94) {
    local_94 = in_ESI + in_ECX;
  }
  local_94 = local_94 + -1;
  if (in_EDX + in_R8D < local_98) {
    local_98 = in_EDX + in_R8D;
  }
  local_98 = local_98 + -1;
  local_7c = 0.0;
  local_80 = 0.0;
  local_84 = 0.0;
  local_88 = 0.0;
  if ((-1 < local_8c) && (-1 < local_90)) {
    local_7c = *(float *)(lVar2 + (long)(local_8c * iVar1 + local_90) * 4);
  }
  if ((-1 < local_8c) && (-1 < local_98)) {
    local_80 = *(float *)(lVar2 + (long)(local_8c * iVar1 + local_98) * 4);
  }
  if ((-1 < local_94) && (-1 < local_90)) {
    local_84 = *(float *)(lVar2 + (long)(local_94 * iVar1 + local_90) * 4);
  }
  if ((-1 < local_94) && (-1 < local_98)) {
    local_88 = *(float *)(lVar2 + (long)(local_94 * iVar1 + local_98) * 4);
  }
  return (local_7c - local_84) + (local_88 - local_80);
}

Assistant:

inline float box_integral_improved(struct integral_image *iimage, int row, int col, int rows, int cols) {
    float *data = (float *)iimage->data;
    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;
    float temp0, temp1, res;

    // subtracting by one for row/col because row/col is inclusive.
    int r0 = MIN(row, height) - 1;         // r - 3
    int c0 = MIN(col, width) - 1;          // c - b - 1
    int r1 = MIN(row + rows, height) - 1;  // r - 3 + 5
    int c1 = MIN(col + cols, width) - 1;   // c - b + filter_size - 1

    // Example with 9x9 filter at (0,0)
    // A: (-3, -5)
    // B: (-3, 8)
    // C: (2, -1)
    // D: (2, 4)

    float A = 0.0f;
    float B = 0.0f;
    float C = 0.0f;
    float D = 0.0f;

    if (r0 >= 0 && c0 >= 0) {
        A = data[r0 * data_width + c0];
    }
    if (r0 >= 0 && c1 >= 0) {
        B = data[r0 * data_width + c1];
    }
    if (r1 >= 0 && c0 >= 0) {
        C = data[r1 * data_width + c0];
    }
    if (r1 >= 0 && c1 >= 0) {
        D = data[r1 * data_width + c1];
    }

    // there was a floating point arithmetic bug in the original implementation
    // this fixes it and now fmaxf is not needed
    // use this for validation:
    temp0 = A - C;
    temp1 = D - B;
    res = temp0 + temp1;
    
    return res;
}